

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_base_offset_addr(DisasContext_conflict6 *ctx,TCGv_i64 addr,int base,int offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  int offset_local;
  int base_local;
  TCGv_i64 addr_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (base == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,addr,(long)offset);
  }
  else if (offset == 0) {
    gen_load_gpr(tcg_ctx_00,addr,base);
  }
  else {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,addr,(long)offset);
    gen_op_addr_add(ctx,addr,tcg_ctx_00->cpu_gpr[base],addr);
  }
  return;
}

Assistant:

static void gen_base_offset_addr(DisasContext *ctx, TCGv addr,
                                 int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (base == 0) {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
    } else if (offset == 0) {
        gen_load_gpr(tcg_ctx, addr, base);
    } else {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
        gen_op_addr_add(ctx, addr, tcg_ctx->cpu_gpr[base], addr);
    }
}